

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void internal_insert_commands_before_after(Am_Object *cmd,bool before)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  unsigned_short uVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ostream *poVar6;
  void *this;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object new_cmd;
  Am_Object this_cmd;
  Am_Object insert_after;
  Am_Object last_line;
  Am_Object insert_before;
  Am_Object first_line;
  Am_Value_List local_a8;
  undefined1 local_98 [8];
  Am_Value_List original_command_list;
  Am_Value_List orig_cmds;
  Am_Object execute_command;
  undefined1 local_68 [8];
  Am_Value_List new_cmds;
  Am_Object undo_db;
  Am_Value_List sel_list;
  Am_Object scroll_menu;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object script_window;
  bool before_local;
  Am_Object *cmd_local;
  
  script_window.data._7_1_ = before;
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)&local_28);
  Am_Object::~Am_Object(&local_28);
  pAVar4 = Am_Object::Get(&local_20,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object((Am_Object *)&sel_list.item,pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)&sel_list.item,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&undo_db,pAVar4);
  pAVar4 = Am_Object::Get(&local_20,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object((Am_Object *)&new_cmds.item,pAVar4);
  Am_Object::Get_Object(&execute_command,(short)&new_cmds + 8,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar4 = Am_Object::Get(&execute_command,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_68,pAVar4);
  Am_Object::~Am_Object(&execute_command);
  pAVar4 = Am_Object::Get(&local_20,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object((Am_Object *)&orig_cmds.item,pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)&orig_cmds.item,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&original_command_list.item,pAVar4);
  pAVar4 = Am_Object::Get((Am_Object *)&orig_cmds.item,Am_ORIGINAL_COMMAND_LIST,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_98,pAVar4);
  Am_Value_List::Copy(&local_a8);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_a8);
  Am_Object::Set(cmd,0x16c,pAVar5,0);
  Am_Value_List::~Am_Value_List(&local_a8);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  Am_Value_List::Copy((Am_Value_List *)&first_line);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&first_line);
  Am_Object::Set(cmd,AVar1,pAVar5,1);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&first_line);
  if ((script_window.data._7_1_ & 1) == 0) {
    bVar2 = Am_Value_List::Valid((Am_Value_List *)&undo_db);
    if (bVar2) {
      uVar3 = Am_Value_List::Length((Am_Value_List *)&undo_db);
      pAVar4 = Am_Value_List::Get_Nth((Am_Value_List *)&undo_db,uVar3 - 1);
      Am_Object::Am_Object(&insert_after,pAVar4);
      pAVar4 = Am_Object::Get(&insert_after,0xc5,0);
      Am_Object::Am_Object(&this_cmd,pAVar4);
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&this_cmd);
      bVar2 = Am_Value_List::Start_Member((Am_Value_List *)&original_command_list.item,pAVar5);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar6 = std::operator<<(poVar6,"Lost insert_after cmd ");
        poVar6 = operator<<(poVar6,&this_cmd);
        poVar6 = std::operator<<(poVar6," from list ");
        poVar6 = operator<<(poVar6,(Am_Value_List *)&original_command_list.item);
        poVar6 = std::operator<<(poVar6," of ");
        poVar6 = operator<<(poVar6,(Am_Object *)&orig_cmds.item);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Value_List::Next((Am_Value_List *)&original_command_list.item);
      Am_Object::~Am_Object(&this_cmd);
      Am_Object::~Am_Object(&insert_after);
    }
    else {
      Am_Value_List::End((Am_Value_List *)&original_command_list.item);
    }
  }
  else {
    bVar2 = Am_Value_List::Valid((Am_Value_List *)&undo_db);
    if (bVar2) {
      pAVar4 = Am_Value_List::Get_First((Am_Value_List *)&undo_db);
      Am_Object::Am_Object(&insert_before,pAVar4);
      pAVar4 = Am_Object::Get(&insert_before,0xc5,0);
      Am_Object::Am_Object(&last_line,pAVar4);
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&last_line);
      bVar2 = Am_Value_List::Start_Member((Am_Value_List *)&original_command_list.item,pAVar5);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
        poVar6 = std::operator<<(poVar6,"Lost insert_before cmd ");
        poVar6 = operator<<(poVar6,&last_line);
        poVar6 = std::operator<<(poVar6," from list ");
        poVar6 = operator<<(poVar6,(Am_Value_List *)&original_command_list.item);
        poVar6 = std::operator<<(poVar6," of ");
        poVar6 = operator<<(poVar6,(Am_Object *)&orig_cmds.item);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        Am_Error();
      }
      Am_Object::~Am_Object(&last_line);
      Am_Object::~Am_Object(&insert_before);
    }
    else {
      Am_Value_List::Start((Am_Value_List *)&original_command_list.item);
    }
  }
  Am_Object::Am_Object(&new_cmd);
  Am_Object::Am_Object(&local_e8);
  Am_Value_List::End((Am_Value_List *)local_68);
  while (bVar2 = Am_Value_List::First((Am_Value_List *)local_68), ((bVar2 ^ 0xffU) & 1) != 0) {
    pAVar4 = Am_Value_List::Get((Am_Value_List *)local_68);
    Am_Object::operator=(&new_cmd,pAVar4);
    if ((am_sdebug & 1U) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"\n adding command ");
      poVar6 = operator<<(poVar6,&new_cmd);
      this = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
    }
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&new_cmd);
    Am_Value_List::Add((Am_Value_List *)local_98,pAVar5,Am_TAIL,true);
    Am_Object::Copy_Value_Only(&local_f0,(char *)&new_cmd);
    Am_Object::operator=(&local_e8,&local_f0);
    Am_Object::~Am_Object(&local_f0);
    Am_Object::Set(&local_e8,0x154,-10,0);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_e8);
    Am_Value_List::Insert((Am_Value_List *)&original_command_list.item,pAVar5,Am_BEFORE,true);
    Am_Value_List::Prev((Am_Value_List *)local_68);
  }
  renumber_script_commands((Am_Value_List *)&original_command_list.item);
  AVar1 = Am_COMMANDS_PROTOTYPES;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&original_command_list.item)
  ;
  Am_Object::Set((Am_Object *)&orig_cmds.item,AVar1,pAVar5,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&original_command_list.item)
  ;
  Am_Object::Set((Am_Object *)&orig_cmds.item,AVar1,pAVar5,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_98);
  Am_Object::Set((Am_Object *)&orig_cmds.item,AVar1,pAVar5,0);
  am_set_commands_into_script_window(&local_20,(Am_Object *)&orig_cmds.item);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&new_cmd);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_98);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&original_command_list.item);
  Am_Object::~Am_Object((Am_Object *)&orig_cmds.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_68);
  Am_Object::~Am_Object((Am_Object *)&new_cmds.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&undo_db);
  Am_Object::~Am_Object((Am_Object *)&sel_list.item);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
internal_insert_commands_before_after(Am_Object &cmd, bool before)
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Value_List new_cmds =
      undo_db.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_VALUE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List orig_cmds = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  Am_Value_List original_command_list =
      execute_command.Get(Am_ORIGINAL_COMMAND_LIST);

  cmd.Set(Am_OLD_VALUE, orig_cmds.Copy());
  cmd.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list.Copy(),
          Am_OK_IF_NOT_THERE);

  if (before) {
    if (sel_list.Valid()) {
      Am_Object first_line = sel_list.Get_First();
      Am_Object insert_before = first_line.Get(Am_COMMAND);
      if (!orig_cmds.Start_Member(insert_before))
        Am_ERROR("Lost insert_before cmd " << insert_before << " from list "
                                           << orig_cmds << " of "
                                           << execute_command);
    } else
      orig_cmds.Start();
  } else {
    if (sel_list.Valid()) {
      Am_Object last_line = sel_list.Get_Nth(sel_list.Length() - 1);
      Am_Object insert_after = last_line.Get(Am_COMMAND);
      if (!orig_cmds.Start_Member(insert_after))
        Am_ERROR("Lost insert_after cmd " << insert_after << " from list "
                                          << orig_cmds << " of "
                                          << execute_command);
      orig_cmds.Next();
    } else
      orig_cmds.End();
  }

  //here orig_cmds is set so can insert at the current element

  //commands come in backwards, swap them
  Am_Object this_cmd, new_cmd;
  for (new_cmds.End(); !new_cmds.First(); new_cmds.Prev()) {
    this_cmd = new_cmds.Get();
    if (am_sdebug)
      std::cout << "\n adding command " << this_cmd << std::endl << std::flush;
    original_command_list.Add(this_cmd);
    new_cmd = this_cmd.Copy_Value_Only();
    new_cmd.Set(Am_IMPLEMENTATION_PARENT, Am_IN_A_SCRIPT);
    orig_cmds.Insert(new_cmd, Am_BEFORE);
  }

  //now fix up the numbering
  renumber_script_commands(orig_cmds);

  execute_command.Set(Am_COMMANDS_PROTOTYPES, orig_cmds);
  execute_command.Set(Am_COMMANDS_IN_SCRIPT, orig_cmds);
  execute_command.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list);

  am_set_commands_into_script_window(script_window, execute_command);
}